

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

RegexPattern * __thiscall Js::FunctionBody::GetLiteralRegex(FunctionBody *this,uint index)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  void *pvVar5;
  
  uVar3 = GetCountField(this,LiteralRegexCount);
  if (uVar3 <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x19a7,"(index < GetLiteralRegexCount())",
                                "index < GetLiteralRegexCount()");
    if (!bVar2) goto LAB_007797fd;
    *puVar4 = 0;
  }
  pvVar5 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,LiteralRegexes);
  if (pvVar5 == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x19a8,"(this->GetLiteralRegexes())","this->GetLiteralRegexes()");
    if (!bVar2) {
LAB_007797fd:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pvVar5 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,LiteralRegexes);
  return *(RegexPattern **)((long)pvVar5 + (ulong)index * 8);
}

Assistant:

UnifiedRegex::RegexPattern *FunctionBody::GetLiteralRegex(const uint index)
    {
        Assert(index < GetLiteralRegexCount());
        Assert(this->GetLiteralRegexes());

        return this->GetLiteralRegexes()[index];
    }